

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O2

void __thiscall
Enhedron::Assertion::Impl::Configurable::VariableValueExpression<bool>::appendVariables
          (VariableValueExpression<bool> *this,
          vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
          *variableList)

{
  bool in_DL;
  string sStack_38;
  
  Convert<bool,void>::toString_abi_cxx11_(&sStack_38,(Convert<bool,void> *)(ulong)this->value,in_DL)
  ;
  std::
  vector<Enhedron::Assertion::Impl::Configurable::Variable,std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>>
  ::emplace_back<char_const*const&,std::__cxx11::string,char_const*const&,int_const&>
            ((vector<Enhedron::Assertion::Impl::Configurable::Variable,std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>>
              *)variableList,&this->variableName,&sStack_38,&this->file,&this->line);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void appendVariables(vector<Variable> &variableList) const {
            variableList.emplace_back(variableName, Convert<Value>::toString(value), file, line);
        }